

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

int elf_open_debugfile_by_debuglink
              (backtrace_state *state,char *filename,char *debuglink_name,uint32_t debuglink_crc,
              backtrace_error_callback error_callback,void *data)

{
  uint32_t uVar1;
  uint32_t got_crc;
  int ddescriptor;
  void *data_local;
  backtrace_error_callback error_callback_local;
  uint32_t debuglink_crc_local;
  char *debuglink_name_local;
  char *filename_local;
  backtrace_state *state_local;
  
  state_local._4_4_ =
       elf_find_debugfile_by_debuglink(state,filename,debuglink_name,error_callback,data);
  if (state_local._4_4_ < 0) {
    state_local._4_4_ = -1;
  }
  else if ((debuglink_crc != 0) &&
          (uVar1 = elf_crc32_file(state,state_local._4_4_,error_callback,data),
          uVar1 != debuglink_crc)) {
    tcmalloc_backtrace_close(state_local._4_4_,error_callback,data);
    state_local._4_4_ = -1;
  }
  return state_local._4_4_;
}

Assistant:

static int
elf_open_debugfile_by_debuglink (struct backtrace_state *state,
				 const char *filename,
				 const char *debuglink_name,
				 uint32_t debuglink_crc,
				 backtrace_error_callback error_callback,
				 void *data)
{
  int ddescriptor;

  ddescriptor = elf_find_debugfile_by_debuglink (state, filename,
						 debuglink_name,
						 error_callback, data);
  if (ddescriptor < 0)
    return -1;

  if (debuglink_crc != 0)
    {
      uint32_t got_crc;

      got_crc = elf_crc32_file (state, ddescriptor, error_callback, data);
      if (got_crc != debuglink_crc)
	{
	  backtrace_close (ddescriptor, error_callback, data);
	  return -1;
	}
    }

  return ddescriptor;
}